

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O3

VarOrConst __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
::Convert(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>_>
          *this)

{
  double *pdVar1;
  anon_union_8_2_43b0091d_for_VarOrConst_1 aVar2;
  bool bVar3;
  undefined8 in_RAX;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  anon_union_8_2_43b0091d_for_VarOrConst_1 aVar5;
  NodeRange NVar6;
  VarOrConst VVar7;
  
  aVar2 = (anon_union_8_2_43b0091d_for_VarOrConst_1)(this->prepro_).lb_;
  aVar5.c_ = 1.0;
  if (1.0 <= aVar2.c_) {
    aVar5 = aVar2;
  }
  (this->prepro_).lb_ = (double)aVar5;
  pdVar1 = &(this->prepro_).ub_;
  if ((aVar5.c_ != *pdVar1) || (NAN(aVar5.c_) || NAN(*pdVar1))) {
    aVar5 = (anon_union_8_2_43b0091d_for_VarOrConst_1)(long)(this->prepro_).result_var_;
    if ((long)aVar5 < 0) {
      bVar3 = MapFind(this);
      in_RAX = CONCAT71(extraout_var,bVar3);
      if (!bVar3) {
        NVar6 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::AddVar(&this->converter_->
                          super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         ,(this->prepro_).lb_,(this->prepro_).ub_,(this->prepro_).type_);
        (this->prepro_).result_var_ = NVar6.ir_.beg_;
        (this->constr_).super_FunctionalConstraint.result_var_ = NVar6.ir_.beg_;
        AddConstraint(this);
        in_RAX = extraout_RAX;
      }
      aVar5._4_4_ = 0;
      aVar5.var_ = (this->prepro_).result_var_;
    }
    uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  else {
    uVar4 = 0;
  }
  VVar7.field_1.c_ = aVar5.c_;
  VVar7._0_8_ = uVar4;
  return VVar7;
}

Assistant:

VarOrConst Convert() {
    MP_DISPATCH( PreprocessArguments() );
    if (ResultIsConstant())
      return VarOrConst::MakeConst( lb() );
    if (ResultVarIsKnown())
      return VarOrConst::MakeVar( GetResultVar() );
    if (MapFind())
      return VarOrConst::MakeVar( GetResultVar() );
    MP_DISPATCH( AddResultVariable() );
    MP_DISPATCH( AddConstraint() );
    return VarOrConst::MakeVar( GetResultVar() );
  }